

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall
FOptionMenuItemOptionBase::MenuEvent(FOptionMenuItemOptionBase *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  int iVar2;
  FOptionValues **ppFVar3;
  ulong uVar4;
  FSoundID local_28;
  FName local_24;
  
  local_24.Index = *(int *)&(this->super_FOptionMenuItem).field_0x24;
  ppFVar3 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
            CheckKey(&OptionValues,&local_24);
  if (((ppFVar3 == (FOptionValues **)0x0) || (*ppFVar3 == (FOptionValues *)0x0)) ||
     (((*ppFVar3)->mValues).Count == 0)) {
LAB_0032be01:
    bVar1 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
  }
  else {
    iVar2 = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(this);
    if ((mkey == 6) || (mkey == 3)) {
      uVar4 = 0;
      if ((int)(iVar2 + 1U) < (int)((*ppFVar3)->mValues).Count) {
        uVar4 = (ulong)(iVar2 + 1U);
      }
    }
    else {
      if (mkey != 2) goto LAB_0032be01;
      if (iVar2 == -1) {
        uVar4 = 0;
      }
      else if (iVar2 < 1) {
        uVar4 = (ulong)(((*ppFVar3)->mValues).Count - 1);
      }
      else {
        uVar4 = (ulong)(iVar2 - 1);
      }
    }
    (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x14])(this,uVar4);
    iVar2 = S_FindSound("menu/change");
    _local_28 = CONCAT44(local_24.Index,iVar2);
    S_Sound(0x22,&local_28,snd_menuvolume.Value,0.0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MenuEvent (int mkey, bool fromcontroller)
	{
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && (*opt)->mValues.Size() > 0)
		{
			int Selection = GetSelection();
			if (mkey == MKEY_Left)
			{
				if (Selection == -1) Selection = 0;
				else if (--Selection < 0) Selection = (*opt)->mValues.Size()-1;
			}
			else if (mkey == MKEY_Right || mkey == MKEY_Enter)
			{
				if (++Selection >= (int)(*opt)->mValues.Size()) Selection = 0;
			}
			else
			{
				return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
			}
			SetSelection(Selection);
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		}
		else
		{
			return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
		}
		return true;
	}